

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O1

void console<>(char *format)

{
  if (console_mode != '\0') {
    printf("\x1b[m");
    printf("[CONSOLE] ");
    printf(format);
    putchar(10);
    return;
  }
  return;
}

Assistant:

void console(const char *format, Args const & ... args){
    if(console_mode == 0){
        return;
    }
    printf("\e[m");
    printf("[CONSOLE] ");
    printf(format, args ...);
    printf("\n");
}